

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2UngreedyUTF8(void)

{
  bool bVar1;
  string target;
  LogMessageFatal local_348;
  RE2 match_sentence_re;
  RE2 match_sentence;
  
  std::__cxx11::string::string((string *)&target,"a aX",(allocator *)&local_348);
  match_sentence_re.pattern_._M_dataplus._M_p = "\\w+X";
  match_sentence_re.pattern_._M_string_length._0_4_ = 4;
  RE2::Options::Options((Options *)&local_348,Latin1);
  RE2::RE2(&match_sentence,(StringPiece *)&match_sentence_re,(Options *)&local_348);
  RE2::RE2(&match_sentence_re,"\\w+X");
  local_348.super_LogMessage._0_8_ = target._M_dataplus._M_p;
  local_348.super_LogMessage._8_4_ = (int)target._M_string_length;
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_348,&match_sentence);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x461);
    std::operator<<((ostream *)&local_348.super_LogMessage.str_,
                    "Check failed: !RE2::FullMatch(target, match_sentence)");
    LogMessageFatal::~LogMessageFatal(&local_348);
  }
  local_348.super_LogMessage._0_8_ = target._M_dataplus._M_p;
  local_348.super_LogMessage._8_4_ = (int)target._M_string_length;
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_348,&match_sentence_re);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x462);
    std::operator<<((ostream *)&local_348.super_LogMessage.str_,
                    "Check failed: !RE2::FullMatch(target, match_sentence_re)");
    LogMessageFatal::~LogMessageFatal(&local_348);
  }
  RE2::~RE2(&match_sentence_re);
  RE2::~RE2(&match_sentence);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::string((string *)&target,"a aX",(allocator *)&local_348);
  match_sentence_re.pattern_._M_dataplus._M_p = "(?U)\\w+X";
  match_sentence_re.pattern_._M_string_length._0_4_ = 8;
  RE2::Options::Options((Options *)&local_348,Latin1);
  RE2::RE2(&match_sentence,(StringPiece *)&match_sentence_re,(Options *)&local_348);
  bVar1 = std::operator==(match_sentence.error_,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x468);
    std::operator<<((ostream *)&local_348.super_LogMessage.str_,
                    "Check failed: (match_sentence.error()) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_348);
  }
  RE2::RE2(&match_sentence_re,"(?U)\\w+X");
  local_348.super_LogMessage._0_8_ = target._M_dataplus._M_p;
  local_348.super_LogMessage._8_4_ = (int)target._M_string_length;
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_348,&match_sentence);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x46b);
    std::operator<<((ostream *)&local_348.super_LogMessage.str_,
                    "Check failed: !RE2::FullMatch(target, match_sentence)");
    LogMessageFatal::~LogMessageFatal(&local_348);
  }
  local_348.super_LogMessage._0_8_ = target._M_dataplus._M_p;
  local_348.super_LogMessage._8_4_ = (int)target._M_string_length;
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_348,&match_sentence_re);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x46c);
    std::operator<<((ostream *)&local_348.super_LogMessage.str_,
                    "Check failed: !RE2::FullMatch(target, match_sentence_re)");
    LogMessageFatal::~LogMessageFatal(&local_348);
  }
  RE2::~RE2(&match_sentence_re);
  RE2::~RE2(&match_sentence);
  std::__cxx11::string::~string((string *)&target);
  return;
}

Assistant:

TEST(RE2, UngreedyUTF8) {
  // Check that ungreedy, UTF8 regular expressions don't match when they
  // oughtn't -- see bug 82246.
  {
    // This code always worked.
    const char* pattern = "\\w+X";
    const string target = "a aX";
    RE2 match_sentence(pattern, RE2::Latin1);
    RE2 match_sentence_re(pattern);

    CHECK(!RE2::FullMatch(target, match_sentence));
    CHECK(!RE2::FullMatch(target, match_sentence_re));
  }
  {
    const char* pattern = "(?U)\\w+X";
    const string target = "a aX";
    RE2 match_sentence(pattern, RE2::Latin1);
    CHECK_EQ(match_sentence.error(), "");
    RE2 match_sentence_re(pattern);

    CHECK(!RE2::FullMatch(target, match_sentence));
    CHECK(!RE2::FullMatch(target, match_sentence_re));
  }
}